

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# option.hpp
# Opt level: O0

void pstore::command_line::
     apply_to_option<pstore::command_line::list<std::__cxx11::string,pstore::command_line::parser<std::__cxx11::string,void>>&,char_const(&)[4],pstore::command_line::details::positional_const&,pstore::command_line::details::comma_separated_const&>
               (list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::command_line::parser<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>_>
                *opt,char (*m0) [4],positional *mods,comma_separated *mods_1)

{
  name local_48;
  comma_separated *local_28;
  comma_separated *mods_local_1;
  positional *mods_local;
  char (*m0_local) [4];
  list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::command_line::parser<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>_>
  *opt_local;
  
  local_28 = mods_1;
  mods_local_1 = (comma_separated *)mods;
  mods_local = (positional *)m0;
  m0_local = (char (*) [4])opt;
  make_modifier(&local_48,*m0);
  name::
  apply<pstore::command_line::list<std::__cxx11::string,pstore::command_line::parser<std::__cxx11::string,void>>>
            (&local_48,
             (list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::command_line::parser<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>_>
              *)m0_local);
  name::~name(&local_48);
  apply_to_option<pstore::command_line::list<std::__cxx11::string,pstore::command_line::parser<std::__cxx11::string,void>>&,pstore::command_line::details::positional_const&,pstore::command_line::details::comma_separated_const&>
            ((list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::command_line::parser<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>_>
              *)m0_local,(positional *)mods_local_1,local_28);
  return;
}

Assistant:

void apply_to_option (Option && opt, M0 && m0, Mods &&... mods) {
            make_modifier (std::forward<M0> (m0)).apply (std::forward<Option> (opt));
            apply_to_option (std::forward<Option> (opt), std::forward<Mods> (mods)...);
        }